

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lanli.c
# Opt level: O3

void print_help(char *basename)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long lVar3;
  
  printf("Usage: %s [OPTION]... [FILE]\n\n",basename);
  puts(
      "Process the HTML in FILE (or standard input), and sanitize it using the Lanli library. The result is written to standard output. Parsing and filtering can be controlled through the options below.\n"
      );
  puts("Main options:");
  printf("  -%c, ",0x6c);
  printf("--%-15s  %s\n","levels=N",
         "Number of additional levels. Zero disables the feature. Default is 0.");
  printf("  -%c, ",0x6e);
  printf("--%-15s  %s\n","max-nesting=N","Size of the tag nesting stack. Default is 16.");
  printf("  -%c, ",0x61);
  printf("--%-15s  %s\n","max-attributes=N",
         "Maximum number of attributes accepted in a tag. Default is 8.");
  printf("  -%c, ",0x54);
  printf("--%-15s  %s\n","time","Show time spent in rendering.");
  printf("  -%c, ",0x69);
  printf("--%-15s  %s\n","input-unit=N","Reading block size. Default is 1024.");
  printf("  -%c, ",0x6f);
  printf("--%-15s  %s\n","output-unit=N","Writing block size. Default is 64.");
  printf("  -%c, ",0x68);
  printf("--%-15s  %s\n","help","Print this help text.");
  printf("  -%c, ",0x76);
  printf("--%-15s  %s\n","version","Print Lanli version.");
  putchar(10);
  puts("Callback selection:");
  lVar3 = 0x10;
  do {
    uVar1 = *(undefined8 *)((long)&__do_global_dtors_aux_fini_array_entry + lVar3);
    uVar2 = *(undefined8 *)((long)&callbacks_info[0].callback + lVar3);
    printf("      ");
    printf("--%-15s  %s\n",uVar1,uVar2);
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0xa0);
  putchar(10);
  puts("Flags:");
  lVar3 = 0x10;
  do {
    uVar1 = *(undefined8 *)((long)&callbacks_info[5].description + lVar3);
    uVar2 = *(undefined8 *)((long)&flags_info[0].flag + lVar3);
    printf("      ");
    printf("--%-15s  %s\n",uVar1,uVar2);
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x70);
  putchar(10);
  puts(
      "Flags can be negated by prepending \'no\' to them, as in \'--no-parse-comments\' or \'--no-skip-invalid\'. Options are processed in order, so in case of contradictory options the last specified stands.\n"
      );
  puts(
      "When FILE is \'-\', read standard input. If no FILE was given, read standard input. Use \'--\' to signal end of option parsing. Exit status is 0 if no errors occured, 1 with option parsing errors or 5 with I/O errors.\n"
      );
  return;
}

Assistant:

static void print_help(const char *basename) {
  size_t i;

  /* usage */
  printf("Usage: %s [OPTION]... [FILE]\n\n", basename);

  /* description */
  printf("Process the HTML in FILE (or standard input), and sanitize it using the Lanli library. "
         "The result is written to standard output. Parsing and filtering can be controlled through the options below.\n\n");

  /* main options */
  printf("Main options:\n");
  print_option('l', "levels=N", "Number of additional levels. Zero disables the feature. Default is " str(DEF_LEVELS) ".");
  print_option('n', "max-nesting=N", "Size of the tag nesting stack. Default is " str(DEF_MAX_NESTING) ".");
  print_option('a', "max-attributes=N", "Maximum number of attributes accepted in a tag. Default is " str(DEF_MAX_ATTRIBUTES) ".");
  print_option('T', "time", "Show time spent in rendering.");
  print_option('i', "input-unit=N", "Reading block size. Default is " str(DEF_IUNIT) ".");
  print_option('o', "output-unit=N", "Writing block size. Default is " str(DEF_OUNIT) ".");
  print_option('h', "help", "Print this help text.");
  print_option('v', "version", "Print Lanli version.");
  printf("\n");

  /* callbacks */
  printf("Callback selection:\n");
  for (i = 0; i < count_of(callbacks_info); i++) {
    struct callback_info *callback = &callbacks_info[i];
    print_option(  0, callback->option_name, callback->description);
  }
  printf("\n");

  /* features */
  printf("Flags:\n");
  for (i = 0; i < count_of(flags_info); i++) {
    struct flag_info *flag = &flags_info[i];
    print_option(  0, flag->option_name, flag->description);
  }
  printf("\n");

  /* ending */
  printf("Flags can be negated by prepending 'no' to them, as in '--no-parse-comments' or '--no-skip-invalid'. "
         "Options are processed in order, so in case of contradictory options the last specified stands.\n\n");

  printf("When FILE is '-', read standard input. If no FILE was given, read standard input. Use '--' to signal end of option parsing. "
         "Exit status is 0 if no errors occured, 1 with option parsing errors or 5 with I/O errors.\n\n");
}